

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_sqrt(void)

{
  int iVar1;
  int j;
  int i;
  secp256k1_fe t;
  secp256k1_fe s;
  secp256k1_fe x;
  secp256k1_fe ns;
  undefined4 in_stack_ffffffffffffff58;
  int iVar2;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar3;
  secp256k1_fe *in_stack_ffffffffffffff60;
  secp256k1_fe *in_stack_ffffffffffffff70;
  secp256k1_fe *in_stack_ffffffffffffff80;
  secp256k1_fe *in_stack_ffffffffffffffa8;
  secp256k1_fe *in_stack_ffffffffffffffb0;
  secp256k1_fe *in_stack_ffffffffffffffd8;
  
  secp256k1_fe_impl_set_int((secp256k1_fe *)&stack0xffffffffffffffb0,0);
  secp256k1_fe_impl_sqr
            (in_stack_ffffffffffffff60,
             (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  test_sqrt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  for (iVar3 = 1; iVar3 < 0x65; iVar3 = iVar3 + 1) {
    secp256k1_fe_impl_set_int((secp256k1_fe *)&stack0xffffffffffffffb0,iVar3);
    secp256k1_fe_impl_sqr
              (in_stack_ffffffffffffff60,(secp256k1_fe *)CONCAT44(iVar3,in_stack_ffffffffffffff58));
    test_sqrt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    secp256k1_fe_impl_negate_unchecked
              ((secp256k1_fe *)&stack0xffffffffffffff60,(secp256k1_fe *)&stack0xffffffffffffff88,1);
    test_sqrt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  iVar3 = 0;
  do {
    if (9 < iVar3) {
      return;
    }
    random_fe_non_square(in_stack_ffffffffffffff80);
    for (iVar2 = 0; iVar2 < COUNT; iVar2 = iVar2 + 1) {
      testutil_random_fe(in_stack_ffffffffffffff70);
      secp256k1_fe_impl_sqr(in_stack_ffffffffffffff60,(secp256k1_fe *)CONCAT44(iVar3,iVar2));
      iVar1 = secp256k1_fe_impl_is_square_var(in_stack_ffffffffffffffd8);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
                ,0xc9f,"test condition failed: secp256k1_fe_is_square_var(&s)");
        abort();
      }
      test_sqrt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      secp256k1_fe_impl_negate_unchecked
                ((secp256k1_fe *)&stack0xffffffffffffff60,(secp256k1_fe *)&stack0xffffffffffffff88,1
                );
      iVar1 = secp256k1_fe_impl_is_square_var(in_stack_ffffffffffffffd8);
      if (iVar1 != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
                ,0xca2,"test condition failed: !secp256k1_fe_is_square_var(&t)");
        abort();
      }
      test_sqrt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      secp256k1_fe_impl_mul
                (in_stack_ffffffffffffff60,(secp256k1_fe *)CONCAT44(iVar3,iVar2),
                 (secp256k1_fe *)0x1182ec);
      test_sqrt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

static void run_sqrt(void) {
    secp256k1_fe ns, x, s, t;
    int i;

    /* Check sqrt(0) is 0 */
    secp256k1_fe_set_int(&x, 0);
    secp256k1_fe_sqr(&s, &x);
    test_sqrt(&s, &x);

    /* Check sqrt of small squares (and their negatives) */
    for (i = 1; i <= 100; i++) {
        secp256k1_fe_set_int(&x, i);
        secp256k1_fe_sqr(&s, &x);
        test_sqrt(&s, &x);
        secp256k1_fe_negate(&t, &s, 1);
        test_sqrt(&t, NULL);
    }

    /* Consistency checks for large random values */
    for (i = 0; i < 10; i++) {
        int j;
        random_fe_non_square(&ns);
        for (j = 0; j < COUNT; j++) {
            testutil_random_fe(&x);
            secp256k1_fe_sqr(&s, &x);
            CHECK(secp256k1_fe_is_square_var(&s));
            test_sqrt(&s, &x);
            secp256k1_fe_negate(&t, &s, 1);
            CHECK(!secp256k1_fe_is_square_var(&t));
            test_sqrt(&t, NULL);
            secp256k1_fe_mul(&t, &s, &ns);
            test_sqrt(&t, NULL);
        }
    }
}